

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_trace_file.c
# Opt level: O2

mFILE * find_file_dir(char *file,char *dirname)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  mFILE *pmVar5;
  char *pcVar6;
  char *pcVar7;
  char *endp;
  char path [4097];
  
  sVar2 = strlen(dirname);
  if ((*file == '/') ||
     ((pcVar7 = (char *)(sVar2 - (dirname[sVar2 - 1] == '/')), pcVar7 == (char *)0x1 &&
      (*dirname == '.')))) {
    pcVar7 = path;
  }
  else {
    pcVar6 = path;
    path[0] = '\0';
    while (pcVar3 = strchr(dirname,0x25), pcVar3 != (char *)0x0) {
      sVar2 = strtol(pcVar3 + 1,&endp,10);
      if (*endp == 's') {
        strncpy(pcVar6,dirname,(long)pcVar3 - (long)dirname);
        pcVar6 = pcVar6 + ((long)pcVar3 - (long)dirname);
        if (sVar2 == 0) {
          strcpy(pcVar6,file);
          sVar2 = strlen(file);
        }
        else {
          strncpy(pcVar6,file,sVar2);
          sVar4 = strlen(file);
          if (sVar4 < sVar2) {
            sVar2 = sVar4;
          }
        }
        pcVar6 = pcVar6 + sVar2;
        file = file + sVar2;
        pcVar7 = dirname + ((long)pcVar7 - (long)(endp + 1));
        dirname = endp + 1;
      }
      else {
        strncpy(pcVar6,dirname,(size_t)(endp + (1 - (long)dirname)));
        pcVar6 = pcVar6 + ((long)(endp + 1) - (long)dirname);
        dirname = endp + 1;
      }
    }
    strncpy(pcVar6,dirname,(size_t)pcVar7);
    pcVar3 = (char *)strlen(dirname);
    if (pcVar3 < pcVar7) {
      pcVar7 = pcVar3;
    }
    pcVar6[(long)pcVar7] = '\0';
    if (*file == '\0') goto LAB_00123a91;
    pcVar6[(long)pcVar7] = '/';
    pcVar7 = pcVar6 + (long)pcVar7 + 1;
  }
  strcpy(pcVar7,file);
LAB_00123a91:
  iVar1 = is_file(path);
  if (iVar1 == 0) {
    pmVar5 = (mFILE *)0x0;
  }
  else {
    pmVar5 = mfopen(path,"rb");
  }
  return pmVar5;
}

Assistant:

static mFILE *find_file_dir(char *file, char *dirname) {
    char path[PATH_MAX+1];
    size_t len = strlen(dirname);
    char *cp;

    if (dirname[len-1] == '/')
	len--;

    /* Special case for "./" or absolute filenames */
    if (*file == '/' || (len==1 && *dirname == '.')) {
	sprintf(path, "%s", file);
    } else {
	/* Handle %[0-9]*s expansions, if required */
	char *path_end = path;
	*path = 0;
	while ((cp = strchr(dirname, '%'))) {
	    char *endp;
	    long l = strtol(cp+1, &endp, 10);
	    if (*endp != 's') {
		strncpy(path_end, dirname, (endp+1)-dirname);
		path_end += (endp+1)-dirname;
		dirname = endp+1;
		continue;
	    }
	    
	    strncpy(path_end, dirname, cp-dirname);
	    path_end += cp-dirname;
	    if (l) {
		strncpy(path_end, file, l);
		path_end += MIN(strlen(file), l);
		file     += MIN(strlen(file), l);
	    } else {
		strcpy(path_end, file);
		path_end += strlen(file);
		file     += strlen(file);
	    }
	    len -= (endp+1) - dirname;
	    dirname = endp+1;
	}
	strncpy(path_end, dirname, len);
	path_end += MIN(strlen(dirname), len);
	*path_end = 0;
	if (*file) {
	    *path_end++ = '/';
	    strcpy(path_end, file);
	}

	//fprintf(stderr, "*PATH=\"%s\"\n", path);
    }

    if (is_file(path)) {
	return mfopen(path, "rb");
    }

    return NULL;
}